

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineCam::EvaluateCamPoint
          (ChLineCam *this,double par,ChVector<double> *res,double *g,double *q)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  bool bVar28;
  eChCamType eVar29;
  double dVar30;
  double dVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar52 [16];
  double dVar45;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar49;
  undefined1 auVar63 [16];
  double dVar50;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar51;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 local_a8 [16];
  double local_78;
  double local_58;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  
  *g = 0.0;
  *q = 0.0;
  if (res != (ChVector<double> *)&VNULL) {
    res->m_data[0] = VNULL;
    res->m_data[1] = DAT_00b689a0;
    res->m_data[2] = DAT_00b689a8;
  }
  dVar30 = (par + par) * 3.141592653589793;
  bVar1 = this->internal;
  bVar28 = this->negative;
  dVar46 = dVar30;
  if (bVar28 == true) {
    local_78 = -1.0;
    if ((this->type == CAM_TYPE_FLATOSCILLATE) || (this->type == CAM_TYPE_ROTATEFOLLOWER)) {
      local_58 = 1.0;
      dVar46 = 6.283185307179586 - dVar30;
    }
    else {
      local_58 = -1.0;
    }
  }
  else {
    local_58 = 1.0;
    local_78 = 1.0;
  }
  dVar42 = this->Rr;
  dVar41 = this->e;
  dVar44 = dVar46;
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar50 = 0.0;
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  if (CAM_TYPE_FLATOSCILLATE < this->type) {
    *g = 0.0;
    local_a8 = ZEXT816(0);
    local_58 = 0.0;
    goto LAB_0080258e;
  }
  dVar41 = (double)((ulong)(bVar28 & 1) * (long)-dVar41 + (ulong)!(bool)(bVar28 & 1) * (long)dVar41)
  ;
  dVar42 = (double)((ulong)(bVar1 & 1) * (long)-dVar42 + (ulong)!(bool)(bVar1 & 1) * (long)dVar42);
  dVar44 = dVar44 * local_78;
  dVar46 = local_58 * dVar46;
  dVar50 = local_58 * dVar50;
  switch(this->type) {
  case CAM_TYPE_SLIDEFOLLOWER:
    dVar51 = atan(dVar46 / (dVar44 + this->Rb));
    *g = dVar51;
    dVar41 = dVar44 + this->Rb;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar42;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = dVar41 * dVar41;
    auVar43 = vfmadd231sd_fma(auVar110,auVar34,auVar34);
    auVar68._0_8_ = cos(dVar51);
    auVar68._8_56_ = extraout_var;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar43._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar42 * -2.0 * dVar41;
    auVar43 = vfmadd213sd_fma(auVar52,auVar68._0_16_,auVar2);
    if (auVar43._0_8_ < 0.0) {
      local_58 = sqrt(auVar43._0_8_);
    }
    else {
      auVar43 = vsqrtsd_avx(auVar43,auVar43);
      local_58 = auVar43._0_8_;
    }
    dVar41 = sin(*g);
    dVar41 = asin((dVar41 * dVar42) / local_58);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = this->Rb;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar42;
    uVar32 = vcmpsd_avx512f(auVar104,auVar25,1);
    bVar1 = (bool)((byte)uVar32 & 1);
    dVar45 = (double)((ulong)bVar1 * (long)(3.141592653589793 - dVar41) +
                     (ulong)!bVar1 * (long)dVar41);
    dVar41 = this->Rb + dVar44;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar46;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar41 * dVar41;
    auVar43 = vfmadd231sd_fma(auVar67,auVar105,auVar105);
    dVar83 = pow(auVar43._0_8_,1.5);
    auVar115._8_8_ = 0;
    auVar115._0_8_ = dVar50;
    dVar44 = dVar44 + this->Rb;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar44;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = dVar44 * dVar44;
    auVar43 = vfnmadd213sd_fma(auVar115,auVar106,auVar113);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar46 * dVar46;
    auVar43 = vfmadd132sd_fma(auVar107,auVar43,ZEXT816(0x4000000000000000));
    dVar46 = auVar43._0_8_;
    goto LAB_0080257f;
  case CAM_TYPE_ROTATEFOLLOWER:
    dVar83 = dVar44 + this->b0;
    dVar41 = this->p;
    dVar47 = sin(dVar83);
    dVar31 = 1.0 - dVar46;
    dVar51 = this->p;
    dVar45 = this->d;
    dVar48 = cos(dVar83);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar45;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar31;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar48 * dVar51;
    auVar43 = vfnmadd132sd_fma(auVar93,auVar59,auVar8);
    dVar47 = atan2(dVar31 * dVar47 * dVar41,auVar43._0_8_);
    *g = (1.5707963267948966 - dVar83) - dVar47;
    dVar41 = this->p;
    dVar51 = sin(dVar83);
    dVar45 = sin(dVar47);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar51;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar41;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar45 * dVar42;
    auVar43 = vfmsub231sd_fma(auVar60,auVar94,auVar9);
    dVar41 = this->p;
    dVar51 = this->d;
    auVar73._0_8_ = cos(dVar83);
    auVar73._8_56_ = extraout_var_04;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar51;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar41;
    auVar3 = vfnmadd132sd_fma(auVar73._0_16_,auVar95,auVar10);
    auVar74._0_8_ = cos(dVar47);
    auVar74._8_56_ = extraout_var_05;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = auVar3._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar42;
    auVar3 = vfnmadd132sd_fma(auVar74._0_16_,auVar96,auVar11);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar3._0_8_ * auVar3._0_8_ + auVar43._0_8_ * auVar43._0_8_;
    auVar43 = vsqrtsd_avx(auVar61,auVar61);
    local_58 = auVar43._0_8_;
    dVar41 = this->p;
    dVar51 = sin(dVar83);
    dVar45 = sin(dVar47);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar51;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar41;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar45 * dVar42;
    auVar43 = vfmsub231sd_fma(auVar62,auVar97,auVar12);
    dVar41 = this->p;
    dVar51 = this->d;
    auVar75._0_8_ = cos(dVar83);
    auVar75._8_56_ = extraout_var_06;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar51;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar41;
    auVar3 = vfnmadd132sd_fma(auVar75._0_16_,auVar98,auVar13);
    auVar76._0_8_ = cos(dVar47);
    auVar76._8_56_ = extraout_var_07;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auVar3._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar42;
    auVar3 = vfnmadd231sd_fma(auVar99,auVar76._0_16_,auVar14);
    dVar45 = atan2(auVar43._0_8_,auVar3._0_8_);
    dVar41 = this->p;
    dVar83 = dVar83 + dVar47;
    dVar48 = cos(dVar83);
    dVar51 = this->p;
    dVar49 = sin(dVar83);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = dVar48;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar31 * dVar41 * dVar46;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar49 * dVar50 * dVar51;
    auVar3 = vfmsub231sd_fma(auVar63,auVar100,auVar15);
    dVar46 = this->d;
    dVar50 = cos(dVar47);
    dVar41 = this->p;
    dVar51 = cos(dVar83);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar50;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar46;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar51 * dVar31 * dVar41;
    auVar4 = vfmsub231sd_fma(auVar64,auVar101,auVar16);
    dVar46 = this->p;
    dVar41 = cos(dVar44 + this->b0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar31;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->d;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar41 * dVar46;
    auVar43 = vfmadd213sd_fma(auVar102,auVar65,auVar17);
    dVar46 = cos(dVar47);
    dVar83 = auVar43._0_8_ / (dVar46 * (auVar3._0_8_ / auVar4._0_8_ + 1.0));
    goto LAB_00802583;
  case CAM_TYPE_ECCENTRICFOLLOWER:
    auVar92._8_8_ = 0;
    auVar92._0_8_ = this->Rb;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = this->e * this->e;
    auVar43 = vfmsub231sd_fma(auVar57,auVar92,auVar92);
    if (auVar43._0_8_ < 0.0) {
      dVar51 = sqrt(auVar43._0_8_);
    }
    else {
      auVar43 = vsqrtsd_avx(auVar43,auVar43);
      dVar51 = auVar43._0_8_;
    }
    dVar44 = dVar44 + dVar51;
    dVar51 = atan((dVar46 - dVar41) / dVar44);
    *g = dVar51;
    auVar77._0_8_ = cos(dVar51);
    auVar77._8_56_ = extraout_var_08;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar42;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar44;
    auVar3 = vfnmadd213sd_fma(auVar77._0_16_,auVar35,auVar18);
    auVar78._0_8_ = sin(*g);
    auVar78._8_56_ = extraout_var_09;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar42;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar41;
    auVar43 = vfmadd213sd_fma(auVar78._0_16_,auVar36,auVar19);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auVar43._0_8_ * auVar43._0_8_ + auVar3._0_8_ * auVar3._0_8_;
    auVar43 = vsqrtsd_avx(auVar66,auVar66);
    local_58 = auVar43._0_8_;
    auVar79._0_8_ = sin(*g);
    auVar79._8_56_ = extraout_var_10;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar42;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar41;
    auVar43 = vfmadd213sd_fma(auVar79._0_16_,auVar37,auVar20);
    auVar80._0_8_ = cos(*g);
    auVar80._8_56_ = extraout_var_11;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar42;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar44;
    auVar3 = vfnmadd213sd_fma(auVar80._0_16_,auVar38,auVar21);
    dVar51 = atan(auVar43._0_8_ / auVar3._0_8_);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar42;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = this->Rb;
    uVar32 = vcmpsd_avx512f(auVar39,auVar22,0xe);
    bVar1 = (bool)((byte)uVar32 & 1);
    dVar45 = (double)((ulong)bVar1 * (long)(dVar51 + 3.141592653589793) +
                     (ulong)!bVar1 * (long)dVar51);
    dVar51 = dVar41 - dVar46;
    dVar83 = pow(dVar51 * dVar51 + dVar44 * dVar44,1.5);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar41;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = dVar46;
    auVar43 = vfmadd231sd_fma(auVar40,auVar111,ZEXT816(0xc000000000000000));
    auVar112._8_8_ = 0;
    auVar112._0_8_ = dVar44 * dVar44;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar51;
    auVar43 = vfmadd132sd_fma(auVar43,auVar112,auVar23);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar50;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar44;
    auVar43 = vfnmadd132sd_fma(auVar103,auVar43,auVar24);
    dVar46 = auVar43._0_8_;
LAB_0080257f:
    dVar83 = dVar83 / dVar46;
LAB_00802583:
    local_a8._8_8_ = 0;
    local_a8._0_8_ = dVar45 + dVar30;
    dVar41 = dVar83 - dVar42;
    break;
  case CAM_TYPE_FLAT:
    *g = 0.0;
    dVar42 = dVar44 + this->Rb;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar42 * dVar42;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = dVar46;
    auVar43 = vfmadd231sd_fma(auVar58,auVar114,auVar114);
    auVar43 = vsqrtsd_avx(auVar43,auVar43);
    local_58 = auVar43._0_8_;
    dVar46 = atan2(dVar46,dVar42);
    local_a8._8_8_ = 0;
    local_a8._0_8_ = dVar46 + dVar30;
    dVar41 = dVar44 + this->Rb + dVar50;
    break;
  case CAM_TYPE_FLATOSCILLATE:
    dVar44 = dVar44 + this->b0;
    dVar42 = this->d;
    dVar45 = cos(dVar44);
    dVar51 = 1.0 - dVar46;
    dVar83 = (dVar45 * dVar42) / dVar51;
    dVar42 = atan2(dVar41,dVar83);
    *g = dVar42;
    dVar42 = this->d;
    auVar69._0_8_ = sin(dVar44);
    auVar69._8_56_ = extraout_var_00;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar42;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar41;
    auVar43 = vfnmadd132sd_fma(auVar69._0_16_,auVar84,auVar43);
    auVar70._0_8_ = cos(dVar44);
    auVar70._8_56_ = extraout_var_01;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = auVar43._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar83;
    auVar3 = vfnmadd132sd_fma(auVar70._0_16_,auVar85,auVar3);
    dVar42 = sin(dVar44);
    dVar45 = cos(dVar44);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar42;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar83;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar45 * dVar41;
    auVar43 = vfmsub231sd_fma(auVar53,auVar86,auVar4);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auVar43._0_8_ * auVar43._0_8_ + auVar3._0_8_ * auVar3._0_8_;
    auVar43 = vsqrtsd_avx(auVar54,auVar54);
    local_58 = auVar43._0_8_;
    dVar42 = sin(dVar44);
    dVar45 = cos(dVar44);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar42;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar83;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar45 * dVar41;
    auVar43 = vfmsub231sd_fma(auVar55,auVar87,auVar5);
    dVar42 = this->d;
    auVar71._0_8_ = sin(dVar44);
    auVar71._8_56_ = extraout_var_02;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar42;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar41;
    auVar3 = vfnmadd132sd_fma(auVar71._0_16_,auVar88,auVar6);
    auVar72._0_8_ = cos(dVar44);
    auVar72._8_56_ = extraout_var_03;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = auVar3._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar83;
    auVar3 = vfnmadd231sd_fma(auVar89,auVar72._0_16_,auVar7);
    dVar42 = atan2(auVar43._0_8_,auVar3._0_8_);
    local_a8._8_8_ = 0;
    local_a8._0_8_ = dVar42 + dVar30;
    dVar30 = this->d;
    dVar42 = sin(dVar44);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = dVar46;
    auVar43 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar90,ZEXT816(0xc000000000000000));
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar42 * dVar30;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar83 * dVar50;
    auVar43 = vfmadd231sd_fma(auVar91,auVar56,auVar43);
    dVar41 = auVar43._0_8_ / (dVar51 * dVar51) - dVar41;
  }
  *q = dVar41;
LAB_0080258e:
  if (this->negative == true) {
    eVar29 = this->type;
    if ((eVar29 < CAM_TYPE_FLATOSCILLATE) && (eVar29 != CAM_TYPE_ROTATEFOLLOWER)) {
      local_a8._8_8_ = 0;
      local_a8._0_8_ = (double)local_a8._0_8_ + 3.141592653589793;
    }
    if ((eVar29 == CAM_TYPE_FLATOSCILLATE) || (eVar29 == CAM_TYPE_ROTATEFOLLOWER)) {
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar43 = vxorpd_avx512vl(local_a8,auVar33);
      local_a8._0_8_ = auVar43._0_8_;
    }
  }
  res->m_data[2] = 0.0;
  dVar30 = (this->center).m_data[0];
  auVar81._0_8_ = cos((double)local_a8._0_8_ + this->phase);
  auVar81._8_56_ = extraout_var_12;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar30;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_58;
  auVar43 = vfmadd132sd_fma(auVar81._0_16_,auVar108,auVar26);
  res->m_data[0] = auVar43._0_8_;
  dVar30 = (this->center).m_data[1];
  auVar82._0_8_ = sin((double)local_a8._0_8_ + this->phase);
  auVar82._8_56_ = extraout_var_13;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar30;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_58;
  auVar43 = vfmadd132sd_fma(auVar82._0_16_,auVar109,auVar27);
  res->m_data[1] = auVar43._0_8_;
  return;
}

Assistant:

void ChLineCam::EvaluateCamPoint(double par, ChVector<>& res, double& g, double& q) const {
    double a = par * 2 * CH_C_PI;  // range : par 0..1 -> angle 0...2PI
    double r, f, b, B, fshift, y, ydx, ydxdx, sa, fxalpha, u, uh = 0;
    double sign, signdx, signdxdx;

    // defaults
    g = 0;
    q = 0;
    res = VNULL;

    double radius = internal ? -Rr : +Rr;
    double ecc = negative ? -e : +e;

    fxalpha = a;
    sign = signdx = signdxdx = +1;

    if (negative) {
        sign = signdx = signdxdx = -1;  // reverse sign

        if ((type == CAM_TYPE_ROTATEFOLLOWER) || (type == CAM_TYPE_FLATOSCILLATE)) {
            fxalpha = 2 * CH_C_PI - a;  // also reverse direction
            signdx = signdxdx = +1;
        }
    }

    y = sign * law->Get_y(fxalpha);
    ydx = signdx * law->Get_y_dx(fxalpha);
    ydxdx = signdxdx * law->Get_y_dxdx(fxalpha);

    switch (this->type) {
        case CAM_TYPE_SLIDEFOLLOWER:
            g = atan(ydx / (Rb + y));
            r = sqrt(radius * radius + pow(Rb + y, 2) - 2 * radius * (Rb + y) * cos(g));
            fshift = asin(radius * sin(g) / r);
            if (radius > Rb)
                fshift = CH_C_PI - fshift;
            f = a + fshift;
            q = pow(ydx * ydx + pow(Rb + y, 2), 1.5) / (pow(Rb + y, 2) - ydxdx * (Rb + y) + 2 * (ydx * ydx)) - radius;
            break;
        case CAM_TYPE_ROTATEFOLLOWER:
            b = b0 + y;
            u = atan2((p * sin(b) * (1 - ydx)), (d - p * cos(b) * (1 - ydx)));
            g = CH_C_PI / 2.0 - b - u;
            r = sqrt(pow(p * sin(b) - radius * sin(u), 2) + pow(d - p * cos(b) - radius * cos(u), 2));
            fshift = atan2((p * sin(b) - radius * sin(u)), (d - p * cos(b) - radius * cos(u)));
            f = (a + fshift);
            uh =
                (p * (1 - ydx) * ydx * cos(b + u) - p * ydxdx * sin(b + u)) / (d * cos(u) - p * (1 - ydx) * cos(b + u));
            q = ((p * cos(b0 + y) * (1 - ydx)) + d) / ((1 + uh) * cos(u)) - radius;
            break;
        case CAM_TYPE_ECCENTRICFOLLOWER: {
            double s_dist = Get_s();
            sa = s_dist + y;
            g = atan((ydx - ecc) / (s_dist + y));
            r = sqrt(pow((sa - radius * cos(g)), 2) + pow((ecc + radius * sin(g)), 2));
            fshift = atan((ecc + radius * sin(g)) / (sa - radius * cos(g)));
            if (radius > Rb)
                fshift = CH_C_PI + fshift;
            f = a + fshift;
            q = pow((pow(s_dist + y, 2) + pow(ecc - ydx, 2)), 1.5) /
                    (pow(s_dist + y, 2) + (ecc - ydx) * (ecc - 2 * ydx) - (s_dist + y) * ydxdx) -
                radius;
            break;
        }
        case CAM_TYPE_FLAT:
            g = 0;
            B = ydx;
            r = sqrt(pow(Rb + y, 2) + ydx * ydx);
            f = a + atan2(ydx, (Rb + y));
            q = Rb + y + ydxdx;
            break;
        case CAM_TYPE_FLATOSCILLATE:
            b = b0 + y;
            B = (d * cos(b)) / (1 - ydx);
            g = atan2(ecc, B);
            r = sqrt(pow(d - ecc * sin(b) - B * cos(b), 2) + pow(B * sin(b) - ecc * cos(b), 2));
            f = a + atan2((B * sin(b) - ecc * cos(b)), (d - ecc * sin(b) - B * cos(b)));
            q = (d * sin(b) * (1 - 2 * ydx) + B * ydxdx) / (pow(1 - ydx, 2)) - ecc;
            break;
        default:
            g = r = f = 0;
            break;
    }

    if (negative) {
        if ((type == CAM_TYPE_FLAT) || (type == CAM_TYPE_SLIDEFOLLOWER) || (type == CAM_TYPE_ECCENTRICFOLLOWER))
            f += CH_C_PI;  // polar 180

        if ((type == CAM_TYPE_ROTATEFOLLOWER) || (type == CAM_TYPE_FLATOSCILLATE)) {
            f = -f;  // y mirror
        }
    }

    res.z() = 0;
    res.x() = this->center.x() + r * cos(f + phase);
    res.y() = this->center.y() + r * sin(f + phase);
}